

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalFilterPolicy::CreateFilter
          (InternalFilterPolicy *this,Slice *keys,int n,string *dst)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Slice SVar3;
  int i;
  Slice *mkey;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  char *local_18;
  size_t local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar4 = 0; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
    SVar3 = ExtractUserKey((Slice *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
    puVar2 = (undefined8 *)(in_RSI + (long)iVar4 * 0x10);
    local_18 = SVar3.data_;
    *puVar2 = local_18;
    local_10 = SVar3.size_;
    puVar2[1] = local_10;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_RSI,in_EDX,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalFilterPolicy::CreateFilter(const Slice* keys, int n,
                                        std::string* dst) const {
  // We rely on the fact that the code in table.cc does not mind us
  // adjusting keys[].
  Slice* mkey = const_cast<Slice*>(keys);
  for (int i = 0; i < n; i++) {
    mkey[i] = ExtractUserKey(keys[i]);
    // TODO(sanjay): Suppress dups?
  }
  user_policy_->CreateFilter(keys, n, dst);
}